

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_position_geometry.cpp
# Opt level: O3

unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
 __thiscall
geometrycentral::surface::VertexPositionGeometry::reinterpretTo
          (VertexPositionGeometry *this,SurfaceMesh *targetMesh)

{
  VertexPositionGeometry *this_00;
  SurfaceMesh *in_RDX;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> MStack_68;
  
  this_00 = (VertexPositionGeometry *)operator_new(0x1660);
  VertexPositionGeometry(this_00,in_RDX);
  (this->super_EmbeddedGeometryInterface).super_ExtrinsicGeometryInterface.
  super_IntrinsicGeometryInterface.super_BaseGeometryInterface._vptr_BaseGeometryInterface =
       (_func_int **)this_00;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::reinterpretTo
            (&MStack_68,
             (MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
             targetMesh[7].eHalfedgeArr.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish,in_RDX);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator=
            (this_00->inputVertexPositions,&MStack_68);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::~MeshData(&MStack_68);
  return (__uniq_ptr_data<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>,_true,_true>
          )(__uniq_ptr_data<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VertexPositionGeometry> VertexPositionGeometry::reinterpretTo(SurfaceMesh& targetMesh) {
  std::unique_ptr<VertexPositionGeometry> newGeom(new VertexPositionGeometry(targetMesh));
  newGeom->inputVertexPositions = inputVertexPositions.reinterpretTo(targetMesh);
  return newGeom;
}